

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O3

void __thiscall Js::ActivationObjectEx::InvalidateCachedScope(ActivationObjectEx *this)

{
  Type *addr;
  ScriptFunction *pSVar1;
  
  if ((ulong)this->cachedFuncCount != 0) {
    memset(this->cache,0,(ulong)this->cachedFuncCount << 4);
  }
  pSVar1 = (this->parentFunc).ptr;
  addr = &pSVar1->cachedScopeObj;
  Memory::Recycler::WBSetBit((char *)addr);
  (pSVar1->cachedScopeObj).ptr = (ActivationObjectEx *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void ActivationObjectEx::InvalidateCachedScope()
    {
        if (this->cachedFuncCount != 0)
        {
            // Clearing the cached functions and types isn't strictly necessary for correctness,
            // but we want those objects to be collected even if the scope object is part of someone's
            // closure environment.
            memset(this->cache, 0, this->cachedFuncCount * sizeof(FuncCacheEntry));
        }
        this->parentFunc->SetCachedScope(nullptr);
    }